

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int luaL_newmetatable(lua_State *L,char *tname)

{
  uint32_t *puVar1;
  TValue *pTVar2;
  lua_State *L_00;
  TValue *pTVar3;
  GCtab *pGVar4;
  ulong uVar5;
  lua_State *in_RSI;
  GCtab *in_RDI;
  GCtab *mt;
  TValue *tv;
  GCtab *regt;
  GCobj *o;
  GCtab *t;
  size_t in_stack_ffffffffffffff38;
  lua_State *str;
  lua_State *L_01;
  int local_a4;
  
  L_00 = (lua_State *)(ulong)*(uint *)((ulong)(in_RDI->array).ptr32 + 0x98);
  pGVar4 = in_RDI;
  t = in_RDI;
  str = L_00;
  L_01 = in_RSI;
  strlen((char *)in_RSI);
  lj_str_new(L_01,(char *)str,in_stack_ffffffffffffff38);
  pTVar3 = lj_tab_setstr(L_00,t,(GCstr *)in_RSI);
  if ((pTVar3->field_2).it == 0xffffffff) {
    pGVar4 = lj_tab_new(in_RSI,(uint32_t)((ulong)pGVar4 >> 0x20),(uint32_t)pGVar4);
    (pTVar3->u32).lo = (uint32_t)pGVar4;
    (pTVar3->field_2).it = 0xfffffff4;
    puVar1 = *(uint32_t **)&in_RDI->asize;
    *(uint32_t **)&in_RDI->asize = puVar1 + 2;
    *puVar1 = (uint32_t)pGVar4;
    puVar1[1] = 0xfffffff4;
    if ((str->marked & 4) != 0) {
      uVar5 = (ulong)(in_RDI->array).ptr32;
      str->marked = str->marked & 0xfb;
      (str->gclist).gcptr32 = *(uint32_t *)(uVar5 + 0x3c);
      *(int *)(uVar5 + 0x3c) = (int)str;
    }
    local_a4 = 1;
  }
  else {
    pTVar2 = *(TValue **)&in_RDI->asize;
    *(TValue **)&in_RDI->asize = pTVar2 + 1;
    pTVar2->u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)pTVar3;
    local_a4 = 0;
  }
  return local_a4;
}

Assistant:

LUALIB_API int luaL_newmetatable(lua_State *L, const char *tname)
{
  GCtab *regt = tabV(registry(L));
  TValue *tv = lj_tab_setstr(L, regt, lj_str_newz(L, tname));
  if (tvisnil(tv)) {
    GCtab *mt = lj_tab_new(L, 0, 1);
    settabV(L, tv, mt);
    settabV(L, L->top++, mt);
    lj_gc_anybarriert(L, regt);
    return 1;
  } else {
    copyTV(L, L->top++, tv);
    return 0;
  }
}